

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

pair<QHostAddress,_int> __thiscall QHostAddress::parseSubnet(QHostAddress *this,QString *subnet)

{
  Data *pDVar1;
  QStringView *pQVar2;
  QHostAddressPrivate *pQVar3;
  bool bVar4;
  CutResult CVar5;
  QHostAddressPrivate *pQVar6;
  long lVar7;
  ulong uVar8;
  qsizetype qVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int end;
  undefined8 extraout_RDX;
  uint uVar10;
  uint uVar11;
  quint32 ip4Addr;
  char16_t *pcVar12;
  QHostAddress QVar13;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  pair<QHostAddress,_int> pVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  bool ok;
  QHostAddress mask;
  QList<QStringView> local_88;
  QNetmask local_69;
  totally_ordered_wrapper<QHostAddressPrivate_*> local_68;
  QStringView *pQStack_60;
  QHostAddress local_50;
  QHostAddress local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QHostAddress((QHostAddress *)&local_88);
  local_48.d.d.ptr =
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)
       (QExplicitlySharedDataPointer<QHostAddressPrivate>)local_88.d.d;
  local_88.d.d = (Data *)0x0;
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,0xffffffff);
  ~QHostAddress((QHostAddress *)&local_88);
  pDVar1 = (Data *)(subnet->d).size;
  if (pDVar1 != (Data *)0x0) {
    local_88.d.ptr = (QStringView *)(subnet->d).ptr;
    local_88.d.d = pDVar1;
    pQVar6 = (QHostAddressPrivate *)
             QStringView::indexOf((QStringView *)&local_88,(QChar)0x2f,0,CaseSensitive);
    pQVar2 = (QStringView *)(subnet->d).ptr;
    pQVar3 = (QHostAddressPrivate *)(subnet->d).size;
    local_68.ptr = pQVar3;
    if (pQVar6 != (QHostAddressPrivate *)0xffffffffffffffff) {
      local_68.ptr = pQVar6;
    }
    local_88.d.d = (Data *)CONCAT62(local_88.d.d._2_6_,0x3a);
    QVar16.m_data = (storage_type_conflict *)pQVar2;
    QVar16.m_size = (qsizetype)local_68.ptr;
    QVar19.m_data = (storage_type_conflict *)&local_88;
    QVar19.m_size = 1;
    pQStack_60 = pQVar2;
    lVar7 = QtPrivate::findString(QVar16,0,QVar19,CaseSensitive);
    if (pQVar6 != (QHostAddressPrivate *)0xffffffffffffffff) {
      if ((lVar7 != -1) ||
         (local_88.d.d = (Data *)pQVar3, local_88.d.ptr = pQVar2,
         qVar9 = QStringView::indexOf
                           ((QStringView *)&local_88,(QChar)0x2e,
                            (qsizetype)
                            ((long)&(((QBasicAtomicInt *)&pQVar6->super_QSharedData)->_q_value).
                                    super___atomic_base<int>._M_i + 1),CaseSensitive), qVar9 == -1))
      {
        local_69.length = 0xaa;
        pcVar12 = (subnet->d).ptr;
        local_88.d.d = (Data *)((long)&(((QBasicAtomicInt *)&pQVar6->super_QSharedData)->_q_value).
                                       super___atomic_base<int>._M_i + 1);
        local_50.d.d.ptr =
             (QExplicitlySharedDataPointer<QHostAddressPrivate>)
             (totally_ordered_wrapper<QHostAddressPrivate_*>)0xffffffffffffffff;
        CVar5 = QtPrivate::QContainerImplHelper::mid
                          ((subnet->d).size,(qsizetype *)&local_88,(qsizetype *)&local_50);
        if (CVar5 == Null) {
          QVar13.d.d.ptr =
               (QExplicitlySharedDataPointer<QHostAddressPrivate>)
               (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
          pcVar12 = (char16_t *)0x0;
        }
        else {
          pcVar12 = pcVar12 + (long)local_88.d.d;
          QVar13.d.d.ptr = local_50.d.d.ptr;
        }
        QVar17.m_data = pcVar12;
        QVar17.m_size = (qsizetype)QVar13.d.d.ptr;
        uVar8 = QString::toIntegral_helper(QVar17,(bool *)&local_69,10);
        if (uVar8 >> 0x20 != 0) {
          local_69.length = 0;
          uVar8 = 0;
        }
        uVar10 = (uint)uVar8;
        if (local_69.length == 0) goto LAB_001ae534;
        goto LAB_001ae474;
      }
      local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&local_50);
      local_69.length = 0xff;
      QString::mid((longlong)&local_88,(longlong)subnet);
      bVar4 = setAddress(&local_50,(QString *)&local_88);
      if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((bVar4) && (bVar4 = QNetmask::setAddress(&local_69,&local_50), bVar4)) {
        uVar10 = 0xffffffff;
        if (local_69.length != 0xff) {
          uVar10 = (uint)local_69.length;
        }
        ~QHostAddress(&local_50);
        goto LAB_001ae474;
      }
LAB_001ae624:
      QHostAddress(this,&local_48);
      *(undefined4 *)&this[1].d.d.ptr = puStack_40._0_4_;
LAB_001ae640:
      ~QHostAddress(&local_50);
      goto LAB_001ae807;
    }
    uVar10 = 0xffffffff;
LAB_001ae474:
    if (lVar7 == -1) {
      if ((int)uVar10 < 0x21) {
        local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
        QStringView::split(&local_88,&local_68,0x2e,0,1);
        if ((undefined1 *)(local_88.d.size + -5) < (undefined1 *)0xfffffffffffffffc) {
          QHostAddress(this,&local_48);
          *(undefined4 *)&this[1].d.d.ptr = puStack_40._0_4_;
        }
        else {
          if (local_88.d.ptr[(long)(local_88.d.size + -1)].m_size == 0) {
            QList<QStringView>::removeLast(&local_88);
          }
          bVar4 = (undefined1 *)local_88.d.size != (undefined1 *)0x0;
          if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
            uVar11 = 0;
          }
          else {
            puVar14 = (undefined1 *)0x0;
            lVar7 = 8;
            uVar11 = 0;
            do {
              local_50.d.d.ptr._0_1_ = 0xaa;
              QVar18.m_data = *(storage_type_conflict **)((long)&(local_88.d.ptr)->m_size + lVar7);
              QVar18.m_size = *(qsizetype *)((long)local_88.d.ptr + lVar7 + -8);
              uVar8 = QString::toIntegral_helper(QVar18,(bool *)&local_50,10);
              if (uVar8 >> 0x20 != 0) {
                local_50.d.d.ptr =
                     (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                     ((ulong)local_50.d.d.ptr & 0xffffffffffffff00);
                uVar8 = 0;
              }
              if ((uVar8 < 0x100 & (byte)local_50.d.d.ptr) == 0) {
                QHostAddress(this,&local_48);
                *(undefined4 *)&this[1].d.d.ptr = puStack_40._0_4_;
                break;
              }
              uVar11 = uVar11 << 8 | (uint)uVar8;
              puVar14 = puVar14 + 1;
              lVar7 = lVar7 + 0x10;
              bVar4 = puVar14 < (ulong)local_88.d.size;
            } while (puVar14 < (ulong)local_88.d.size);
          }
          if (!bVar4) {
            ip4Addr = uVar11 << (-(char)((int)local_88.d.size << 3) & 0x1fU);
            uVar11 = uVar10;
            if (uVar10 != 0x20) {
              if (uVar10 == 0) {
                ip4Addr = 0;
              }
              else {
                uVar11 = (int)local_88.d.size << 3;
                if (uVar10 != 0xffffffff) {
                  ip4Addr = (ip4Addr >> (-(char)uVar10 & 0x1fU)) << (-(char)uVar10 & 0x1fU);
                  uVar11 = uVar10;
                }
              }
            }
            QHostAddress(&local_50,ip4Addr);
            QVar13.d.d.ptr = local_50.d.d.ptr;
            local_50.d.d.ptr =
                 (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                 (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0;
            (this->d).d.ptr = (QHostAddressPrivate *)QVar13;
            *(uint *)&this[1].d.d.ptr = uVar11;
            ~QHostAddress(&local_50);
          }
        }
        if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,0x10,0x10);
          }
        }
        goto LAB_001ae807;
      }
    }
    else if ((int)uVar10 < 0x81) {
      uVar11 = 0x80;
      if (-1 < (int)uVar10) {
        uVar11 = uVar10;
      }
      local_50.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QHostAddress(&local_50);
      QString::QString((QString *)&local_88,(QChar *)pQStack_60,(longlong)local_68.ptr);
      bVar4 = setAddress(&local_50,(QString *)&local_88);
      end = extraout_EDX;
      if ((QHostAddressPrivate *)local_88.d.d != (QHostAddressPrivate *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
          end = extraout_EDX_00;
        }
      }
      if (!bVar4) goto LAB_001ae624;
      clearBits((quint8 *)((long)local_50.d.d.ptr + 0x20),uVar11,end);
      QHostAddress(this,&local_50);
      *(uint *)&this[1].d.d.ptr = uVar11;
      goto LAB_001ae640;
    }
  }
LAB_001ae534:
  QHostAddress(this,&local_48);
  *(undefined4 *)&this[1].d.d.ptr = puStack_40._0_4_;
LAB_001ae807:
  ~QHostAddress(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    pVar15._8_8_ = extraout_RDX;
    pVar15.first.d.d.ptr =
         (QExplicitlySharedDataPointer<QHostAddressPrivate>)
         (QExplicitlySharedDataPointer<QHostAddressPrivate>)this;
    return pVar15;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<QHostAddress, int> QHostAddress::parseSubnet(const QString &subnet)
{
    // We support subnets in the form:
    //   ddd.ddd.ddd.ddd/nn
    //   ddd.ddd.ddd/nn
    //   ddd.ddd/nn
    //   ddd/nn
    //   ddd.ddd.ddd.
    //   ddd.ddd.ddd
    //   ddd.ddd.
    //   ddd.ddd
    //   ddd.
    //   ddd
    //   <ipv6-address>/nn
    //
    //  where nn can be an IPv4-style netmask for the IPv4 forms

    const std::pair<QHostAddress, int> invalid = std::pair(QHostAddress(), -1);
    if (subnet.isEmpty())
        return invalid;

    qsizetype slash = subnet.indexOf(u'/');
    QStringView netStr(subnet);
    if (slash != -1)
        netStr.truncate(slash);

    int netmask = -1;
    bool isIpv6 = netStr.contains(u':');

    if (slash != -1) {
        // is the netmask given in IP-form or in bit-count form?
        if (!isIpv6 && subnet.indexOf(u'.', slash + 1) != -1) {
            // IP-style, convert it to bit-count form
            QHostAddress mask;
            QNetmask parser;
            if (!mask.setAddress(subnet.mid(slash + 1)))
                return invalid;
            if (!parser.setAddress(mask))
                return invalid;
            netmask = parser.prefixLength();
        } else {
            bool ok;
            netmask = QStringView{subnet}.mid(slash + 1).toUInt(&ok);
            if (!ok)
                return invalid;     // failed to parse the subnet
        }
    }

    if (isIpv6) {
        // looks like it's an IPv6 address
        if (netmask > 128)
            return invalid;     // invalid netmask
        if (netmask < 0)
            netmask = 128;

        QHostAddress net;
        if (!net.setAddress(netStr.toString()))
            return invalid;     // failed to parse the IP

        clearBits(net.d->a6.c, netmask, 128);
        return std::pair(net, netmask);
    }

    if (netmask > 32)
        return invalid;         // invalid netmask

    // parse the address manually
    auto parts = netStr.split(u'.');
    if (parts.isEmpty() || parts.size() > 4)
        return invalid;         // invalid IPv4 address

    if (parts.constLast().isEmpty())
        parts.removeLast();

    quint32 addr = 0;
    for (int i = 0; i < parts.size(); ++i) {
        bool ok;
        uint byteValue = parts.at(i).toUInt(&ok);
        if (!ok || byteValue > 255)
            return invalid;     // invalid IPv4 address

        addr <<= 8;
        addr += byteValue;
    }
    addr <<= 8 * (4 - parts.size());
    if (netmask == -1) {
        netmask = 8 * parts.size();
    } else if (netmask == 0) {
        // special case here
        // x86's instructions "shr" and "shl" do not operate when
        // their argument is 32, so the code below doesn't work as expected
        addr = 0;
    } else if (netmask != 32) {
        // clear remaining bits
        quint32 mask = quint32(0xffffffff) >> (32 - netmask) << (32 - netmask);
        addr &= mask;
    }

    return std::pair(QHostAddress(addr), netmask);
}